

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaTests.cc
# Opt level: O2

void avro::schema::testCompile(char *schema)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_wrap_stringstream<char> *this;
  allocator<char> local_1d9;
  const_string local_1d8;
  string local_1c8 [8];
  shared_count local_1c0;
  const_string local_1b8;
  basic_wrap_stringstream<char> local_1a8;
  
  local_1d8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SchemaTests.cc"
  ;
  local_1d8.m_end = "";
  memset(&local_1a8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1a8);
  std::operator<<((ostream *)&local_1a8,schema);
  this = &local_1a8;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this);
  local_1b8.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_1b8.m_end = local_1b8.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_1d8,0x99,&local_1b8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,schema,&local_1d9);
  avro::compileJsonSchemaFromString(local_1c8);
  boost::detail::shared_count::~shared_count(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a8);
  return;
}

Assistant:

static void testCompile(const char* schema)
{
    BOOST_TEST_CHECKPOINT(schema);
    compileJsonSchemaFromString(std::string(schema));
}